

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O3

bool __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::try_lock_shared
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  iterator __position;
  size_t sVar1;
  int iVar2;
  id tid_00;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  _Var3;
  system_error *this_00;
  error_category *peVar4;
  error_code __ec;
  id tid;
  id local_38;
  pthread_t local_30;
  
  tid_00._M_thread = pthread_self();
  local_38._M_thread = tid_00._M_thread;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if ((this->e_owner_)._M_thread != tid_00._M_thread) {
    local_30 = tid_00._M_thread;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::thread::id*,std::vector<std::thread::id,std::allocator<std::thread::id>>>,__gnu_cxx::__ops::_Iter_equals_val<std::thread::id_const>>
                      ((this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       (this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_finish);
    __position._M_current =
         (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (_Var3._M_current == __position._M_current) {
      sVar1 = (this->state_).rwcount;
      if (-1 < (long)sVar1) {
        if (sVar1 == 0x7fffffffffffffff) {
          __assert_fail("(s.rwcount & reader_mask) < reader_mask",
                        "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_rwlock_sched.hpp"
                        ,0x5b,"static void yamc::rwlock::ReaderPrefer::acquire_rlock(state &)");
        }
        (this->state_).rwcount = sVar1 + 1;
        if (_Var3._M_current ==
            (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::thread::id,std::allocator<std::thread::id>>::
          _M_realloc_insert<std::thread::id_const&>
                    ((vector<std::thread::id,std::allocator<std::thread::id>> *)&this->s_owner_,
                     __position,&local_38);
          tid_00._M_thread = local_38._M_thread;
        }
        else {
          (__position._M_current)->_M_thread = tid_00._M_thread;
          (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        validator::deadlock::locked((uintptr_t)this,tid_00,true);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
      return -1 < (long)sVar1;
    }
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar4 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar4;
  __ec._0_8_ = 0x23;
  std::system_error::system_error(this_00,__ec,"recursive try_lock_shared");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

bool try_lock_shared()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "recursive try_lock_shared");
#endif
    }
    if (RwLockPolicy::wait_rlock(state_))
      return false;
    RwLockPolicy::acquire_rlock(state_);
    s_owner_.push_back(tid);
    validator::locked(reinterpret_cast<uintptr_t>(this), tid, true);
    return true;
  }